

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O3

Variant * __thiscall BamTools::Variant::operator=(Variant *this,Variant *rhs)

{
  size_t *psVar1;
  ImplBase *pIVar2;
  ImplBase *pIVar3;
  
  pIVar3 = rhs->data;
  if (pIVar3 != (ImplBase *)0x0) {
    pIVar3->refs = pIVar3->refs + 1;
  }
  pIVar2 = this->data;
  if (pIVar2 != (ImplBase *)0x0) {
    psVar1 = &pIVar2->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*pIVar2->_vptr_ImplBase[1])();
      pIVar3 = rhs->data;
    }
  }
  this->data = pIVar3;
  return this;
}

Assistant:

Variant& operator=(const Variant& rhs)
    {
        if (rhs.data != NULL) {
            rhs.data->AddRef();
        }
        if (data != NULL) {
            data->Release();
        }
        data = rhs.data;
        return *this;
    }